

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int copy_from_lzss_window_to_unp(archive_read *a,void **buffer,int64_t startpos,int length)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char *fmt;
  void *__src;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  pvVar3 = a->format->data;
  pvVar2 = *(void **)((long)pvVar3 + 0xe0);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = malloc((ulong)*(uint *)((long)pvVar3 + 0xd8));
    *(void **)((long)pvVar3 + 0xe0) = pvVar2;
    if (pvVar2 != (void *)0x0) goto LAB_00147f9f;
    fmt = "Unable to allocate memory for uncompressed data.";
    iVar1 = 0xc;
LAB_00148057:
    archive_set_error(&a->archive,iVar1,fmt);
    iVar1 = -0x1e;
  }
  else {
LAB_00147f9f:
    uVar4 = (uint)startpos & *(uint *)((long)pvVar3 + 0x358);
    iVar5 = *(uint *)((long)pvVar3 + 0x358) + 1;
    iVar1 = length;
    if (iVar5 < (int)(uVar4 + length)) {
      if ((iVar5 < length) || (uVar6 = iVar5 - uVar4, (int)uVar6 < 0)) {
        fmt = "Bad RAR file data";
        iVar1 = 0x54;
        goto LAB_00148057;
      }
      pvVar2 = (void *)((long)pvVar2 + (ulong)*(uint *)((long)pvVar3 + 0xd4));
      __src = (void *)((long)(int)uVar4 + *(long *)((long)pvVar3 + 0x350));
      if (length - uVar6 != 0 && (int)uVar6 <= length) {
        memcpy(pvVar2,__src,(ulong)uVar6);
        pvVar2 = (void *)((ulong)(uVar6 + *(int *)((long)pvVar3 + 0xd4)) +
                         *(long *)((long)pvVar3 + 0xe0));
        __src = *(void **)((long)pvVar3 + 0x350);
        iVar1 = length - uVar6;
      }
    }
    else {
      pvVar2 = (void *)((long)pvVar2 + (ulong)*(uint *)((long)pvVar3 + 0xd4));
      __src = (void *)((long)(int)uVar4 + *(long *)((long)pvVar3 + 0x350));
    }
    memcpy(pvVar2,__src,(long)iVar1);
    uVar4 = length + *(int *)((long)pvVar3 + 0xd4);
    *(uint *)((long)pvVar3 + 0xd4) = uVar4;
    iVar1 = 0;
    if (uVar4 < *(uint *)((long)pvVar3 + 0xd8)) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = *(void **)((long)pvVar3 + 0xe0);
    }
    *buffer = pvVar3;
  }
  return iVar1;
}

Assistant:

static int
copy_from_lzss_window_to_unp(struct archive_read *a, const void **buffer,
                             int64_t startpos, int length)
{
  int windowoffs, firstpart;
  struct rar *rar = (struct rar *)(a->format->data);

  if (!rar->unp_buffer)
  {
    if ((rar->unp_buffer = malloc(rar->unp_buffer_size)) == NULL)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
  }

  windowoffs = lzss_offset_for_position(&rar->lzss, startpos);
  if(windowoffs + length <= lzss_size(&rar->lzss)) {
    memcpy(&rar->unp_buffer[rar->unp_offset], &rar->lzss.window[windowoffs],
           length);
  } else if (length <= lzss_size(&rar->lzss)) {
    firstpart = lzss_size(&rar->lzss) - windowoffs;
    if (firstpart < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
    }
    if (firstpart < length) {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], firstpart);
      memcpy(&rar->unp_buffer[rar->unp_offset + firstpart],
             &rar->lzss.window[0], length - firstpart);
    } else {
      memcpy(&rar->unp_buffer[rar->unp_offset],
             &rar->lzss.window[windowoffs], length);
    }
  } else {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Bad RAR file data");
      return (ARCHIVE_FATAL);
  }
  rar->unp_offset += length;
  if (rar->unp_offset >= rar->unp_buffer_size)
    *buffer = rar->unp_buffer;
  else
    *buffer = NULL;
  return (ARCHIVE_OK);
}